

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O3

void __thiscall QObject::deleteLater(QObject *this)

{
  uint uVar1;
  int iVar2;
  QObjectData *pQVar3;
  undefined8 uVar4;
  QThreadData *pQVar5;
  QDeferredDeleteEvent *this_00;
  int loopLevel;
  int scopeLevel;
  long in_FS_OFFSET;
  undefined1 local_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QCoreApplicationPrivate::lockThreadPostEventList((QPostEventListLocker *)local_48,this);
  uVar4 = local_48._0_8_;
  if ((QThreadData *)local_48._0_8_ != (QThreadData *)0x0) {
    pQVar3 = (this->d_ptr).d;
    uVar1 = *(uint *)&pQVar3->field_0x30;
    if (-1 < (char)uVar1) {
      *(uint *)&pQVar3->field_0x30 = uVar1 | 0x80;
      pQVar5 = QThreadData::currentThreadData();
      if (pQVar5 == (QThreadData *)0x0) {
        pQVar5 = QThreadData::createCurrentThreadData();
      }
      loopLevel = 0;
      scopeLevel = 0;
      if ((QThreadData *)uVar4 == pQVar5) {
        loopLevel = *(int *)(uVar4 + 0x84);
        iVar2 = *(int *)(uVar4 + 0x88);
        scopeLevel = 1;
        if (loopLevel == 0) {
          scopeLevel = iVar2;
        }
        if (iVar2 != 0) {
          scopeLevel = iVar2;
        }
      }
      std::unique_lock<QMutex>::unlock((unique_lock<QMutex> *)(local_48 + 8));
      this_00 = (QDeferredDeleteEvent *)operator_new(0x18);
      QDeferredDeleteEvent::QDeferredDeleteEvent(this_00,loopLevel,scopeLevel);
      QCoreApplication::postEvent(this,(QEvent *)this_00,0);
    }
  }
  std::unique_lock<QMutex>::~unique_lock((unique_lock<QMutex> *)(local_48 + 8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QObject::deleteLater()
{
#ifdef QT_DEBUG
    if (qApp == this)
        qWarning("You are deferring the delete of QCoreApplication, this may not work as expected.");
#endif


    // De-bounce QDeferredDeleteEvents. Use the post event list mutex
    // to guard access to deleteLaterCalled, so we don't need a separate
    // mutex in QObjectData.
    auto eventListLocker = QCoreApplicationPrivate::lockThreadPostEventList(this);
    if (!eventListLocker.threadData)
        return;

    // FIXME: The deleteLaterCalled flag is part of a bit field,
    // so we likely have data races here, even with the mutex above,
    // as long as we're not guarding every access to the bit field.

    Q_D(QObject);
    if (d->deleteLaterCalled)
        return;

    d->deleteLaterCalled = true;

    int loopLevel = 0;
    int scopeLevel = 0;

    auto *objectThreadData = eventListLocker.threadData;
    if (objectThreadData == QThreadData::current()) {
        // Remember the current running eventloop for deleteLater
        // calls in the object's own thread.

        // Events sent by non-Qt event handlers (such as glib) may not
        // have the scopeLevel set correctly. The scope level makes sure that
        // code like this:
        //     foo->deleteLater();
        //     qApp->processEvents(); // without passing QEvent::DeferredDelete
        // will not cause "foo" to be deleted before returning to the event loop.

        loopLevel = objectThreadData->loopLevel;
        scopeLevel = objectThreadData->scopeLevel;

        // If the scope level is 0 while loopLevel != 0, we are called from a
        // non-conformant code path, and our best guess is that the scope level
        // should be 1. (Loop level 0 is special: it means that no event loops
        // are running.)
        if (scopeLevel == 0 && loopLevel != 0)
            scopeLevel = 1;
    }

    eventListLocker.unlock();
    QCoreApplication::postEvent(this,
        new QDeferredDeleteEvent(loopLevel, scopeLevel));
}